

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O2

void __thiscall duckdb::DecryptionTransport::ReadBlock(DecryptionTransport *this,uint8_t *buf)

{
  int iVar1;
  EncryptionState *pEVar2;
  ulong uVar3;
  
  uVar3 = (ulong)this->transport_remaining - 0x10;
  if (0xfff < uVar3) {
    uVar3 = 0x1000;
  }
  this->read_buffer_size = (uint32_t)uVar3;
  iVar1 = (*this->trans->_vptr_TTransport[6])(this->trans,this->read_buffer + 0x10);
  this->transport_remaining = this->transport_remaining - iVar1;
  pEVar2 = shared_ptr<duckdb::EncryptionState,_true>::operator->(&this->aes);
  (*pEVar2->_vptr_EncryptionState[4])
            (pEVar2,this->read_buffer + 0x10,(ulong)this->read_buffer_size,buf,0x1010);
  this->read_buffer_offset = 0;
  return;
}

Assistant:

void ReadBlock(uint8_t *buf) {
		// Read from transport into read_buffer at one AES block size offset (up to the tag)
		read_buffer_size = MinValue(ParquetCrypto::CRYPTO_BLOCK_SIZE, transport_remaining - ParquetCrypto::TAG_BYTES);
		transport_remaining -= trans.read(read_buffer + ParquetCrypto::BLOCK_SIZE, read_buffer_size);

		// Decrypt from read_buffer + block size into read_buffer start (decryption can trail behind in same buffer)
#ifdef DEBUG
		auto size = aes->Process(read_buffer + ParquetCrypto::BLOCK_SIZE, read_buffer_size, buf,
		                         ParquetCrypto::CRYPTO_BLOCK_SIZE + ParquetCrypto::BLOCK_SIZE);
		D_ASSERT(size == read_buffer_size);
#else
		aes->Process(read_buffer + ParquetCrypto::BLOCK_SIZE, read_buffer_size, buf,
		             ParquetCrypto::CRYPTO_BLOCK_SIZE + ParquetCrypto::BLOCK_SIZE);
#endif
		read_buffer_offset = 0;
	}